

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

int __thiscall QMessageBox::open(QMessageBox *this,char *__file,int __oflag,...)

{
  long lVar1;
  char *pcVar2;
  int __oflag_00;
  char *pcVar3;
  long in_FS_OFFSET;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if (___oflag == (char *)0x0) {
    pcVar3 = "2finished(int)";
  }
  else {
    pcVar2 = strchr(___oflag,0x2a);
    pcVar3 = "2buttonClicked(QAbstractButton*)";
    if (pcVar2 == (char *)0x0) {
      pcVar3 = "2finished(int)";
    }
  }
  QObject::connect(local_40,(char *)this,(QObject *)pcVar3,__file,(ConnectionType)___oflag);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QByteArray::operator=((QByteArray *)(lVar1 + 0x388),pcVar3);
  QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(lVar1 + 0x360),(QObject *)__file)
  ;
  QByteArray::operator=((QByteArray *)(lVar1 + 0x370),___oflag);
  QDialog::open(&this->super_QDialog,___oflag,__oflag_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QMessageBox::open(QObject *receiver, const char *member)
{
    Q_D(QMessageBox);
    const char *signal = member && strchr(member, '*') ? SIGNAL(buttonClicked(QAbstractButton*))
                                                       : SIGNAL(finished(int));
    connect(this, signal, receiver, member);
    d->signalToDisconnectOnClose = signal;
    d->receiverToDisconnectOnClose = receiver;
    d->memberToDisconnectOnClose = member;
    QDialog::open();
}